

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::PickerPrivate::initDrawOffsetForFirstUse(PickerPrivate *this)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  int iVar4;
  QModelIndex QStack_38;
  
  if (this->wasPainted == false) {
    pPVar1 = (this->q->d).d;
    pQVar2 = pPVar1->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&QStack_38,&pPVar1->root);
    iVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&QStack_38);
    iVar4 = this->itemsCount;
    if (iVar3 < iVar4) {
      pPVar1 = (this->q->d).d;
      pQVar2 = pPVar1->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&QStack_38,&pPVar1->root);
      iVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&QStack_38);
      iVar4 = iVar4 - iVar3;
      iVar3 = 0;
      if (0 < iVar4) {
        iVar3 = iVar4 + -1;
      }
      this->drawItemOffset = (iVar3 * this->itemTopMargin + this->stringHeight * iVar4) / 2;
      this->wasPainted = true;
    }
  }
  return;
}

Assistant:

void
PickerPrivate::initDrawOffsetForFirstUse()
{
	if( !wasPainted && q->count() < itemsCount )
	{
		const int freeItemsCount = ( itemsCount - q->count() );

		const int maxOffset = freeItemsCount * stringHeight +
			( freeItemsCount > 0 ? freeItemsCount - 1 : 0 ) * itemTopMargin;

		drawItemOffset = maxOffset / 2;

		wasPainted = true;
	}
}